

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_> *
createSensorValueData
          (vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
           *__return_storage_ptr__,int64_t now,int dataCount)

{
  iterator __position;
  ostream *poVar1;
  long lVar2;
  SensorValues *pSVar3;
  iterator iVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  double dVar8;
  SensorValues sensorValues;
  double local_98;
  double local_90;
  double local_88;
  SensorValues local_78;
  
  bVar7 = 0;
  (__return_storage_ptr__->
  super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>::
  reserve(__return_storage_ptr__,(long)dataCount);
  if (0 < dataCount) {
    lVar6 = now + -0x3d4;
    local_88 = 1e-06;
    uVar5 = 1;
    local_98 = 0.0;
    local_90 = 0.0;
    do {
      local_90 = local_90 + local_88;
      if (((0.0 < local_88) && (0.01 < local_90)) || ((local_88 < 0.0 && (local_90 < -0.01)))) {
        local_88 = -local_88;
      }
      local_98 = local_98 + local_90;
      if ((int)((uVar5 >> 5 & 0x7ffffff) / 0xc35) * -100000 + (int)uVar5 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"index ",6);
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,": v=",4);
        poVar1 = std::ostream::_M_insert<double>(local_98);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", delta=",8);
        poVar1 = std::ostream::_M_insert<double>(local_90);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
      }
      local_78.id = 0xffffffffffffffff;
      local_78.temperatureOutside = local_98 + 19.5;
      local_78.time = lVar6;
      dVar8 = cos(local_98);
      local_78.temperatureInside = dVar8 * local_98 + 23.3;
      dVar8 = sin(local_98);
      local_78.temperatureCpu = dVar8 * local_98 + 42.75;
      local_78.loadCpu1 = 0.8 - local_98;
      local_78.loadCpu2 = 0.7 - local_98;
      local_78.loadCpu3 = 0.6 - local_98;
      local_78.loadCpu4 = 0.5 - local_98;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<objectbox::tsdemo::SensorValues,std::allocator<objectbox::tsdemo::SensorValues>>
        ::_M_realloc_insert<objectbox::tsdemo::SensorValues&>
                  ((vector<objectbox::tsdemo::SensorValues,std::allocator<objectbox::tsdemo::SensorValues>>
                    *)__return_storage_ptr__,__position,&local_78);
      }
      else {
        pSVar3 = &local_78;
        iVar4._M_current = __position._M_current;
        for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
          (iVar4._M_current)->id = pSVar3->id;
          pSVar3 = (SensorValues *)((long)pSVar3 + (ulong)bVar7 * -0x10 + 8);
          iVar4._M_current = iVar4._M_current + (ulong)bVar7 * -0x10 + 8;
        }
        (__return_storage_ptr__->
        super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
        )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x14;
    } while (dataCount + 1 != uVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SensorValues> createSensorValueData(int64_t now, int dataCount) {
    std::vector<SensorValues> values;
    values.reserve(dataCount);
    double deltaDelta = 0.000001;
    double delta = 0.0;
    double value = 0.0;
    for (int i = 1; i <= dataCount; ++i) {
        delta += deltaDelta;
        value += delta;
        if ((delta > 0.01 && deltaDelta > 0) || (delta < -0.01 && deltaDelta < 0)) {
            deltaDelta = -deltaDelta;
        }
        if (i % 100000 == 0) std::cout << "index " << i << ": v=" << value << ", delta=" << delta << std::endl;

        SensorValues sensorValues{OBX_ID_NEW,
                                  now - 1000 + i * 20,
                                  19.5 + value,
                                  23.3 + value * cos(value),
                                  42.75 + value * sin(value),
                                  0.80 - value,
                                  0.7 - value,
                                  0.6 - value,
                                  0.5 - value};
        values.emplace_back(sensorValues);
    }
    return values;
}